

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

String __thiscall
testing::internal::StreamableToString<long_long>(internal *this,longlong *streamable)

{
  size_t extraout_RDX;
  stringstream *psVar2;
  String SVar3;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  size_t sVar1;
  
  Message::Message((Message *)&local_20);
  psVar2 = local_20.ptr_ + 0x10;
  if (local_20.ptr_ == (stringstream *)0x0) {
    psVar2 = (stringstream *)0x0;
  }
  std::ostream::_M_insert<long_long>((longlong)psVar2);
  SVar3 = StringStreamToString(this,local_20.ptr_);
  sVar1 = SVar3.length_;
  if (local_20.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_20.ptr_ + 8))();
    sVar1 = extraout_RDX;
  }
  SVar3.length_ = sVar1;
  SVar3.c_str_ = (char *)this;
  return SVar3;
}

Assistant:

String StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}